

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O0

void __thiscall Noise::setParameter(Noise *this,string *name,string *value)

{
  bool bVar1;
  double local_1b0;
  double d;
  stringstream param;
  ostream local_198;
  string *local_20;
  string *value_local;
  string *name_local;
  Noise *this_local;
  
  local_20 = value;
  value_local = name;
  name_local = (string *)this;
  std::__cxx11::stringstream::stringstream((stringstream *)&d);
  std::operator<<(&local_198,(string *)local_20);
  std::istream::operator>>((istream *)&d,&local_1b0);
  bVar1 = std::operator==(value_local,"mean");
  if (bVar1) {
    (*(this->super_StochasticVariable).super_StochasticProcess.super_Parametric._vptr_Parametric
      [0x12])(local_1b0);
  }
  else {
    bVar1 = std::operator==(value_local,"std.dev.");
    if (bVar1) {
      (*(this->super_StochasticVariable).super_StochasticProcess.super_Parametric._vptr_Parametric
        [0x13])(local_1b0);
    }
    else {
      bVar1 = std::operator==(value_local,"weight");
      if (bVar1) {
        (*(this->super_StochasticVariable).super_StochasticProcess.super_Parametric._vptr_Parametric
          [0x10])(local_1b0);
      }
      else {
        bVar1 = std::operator==(value_local,"rate");
        if (bVar1) {
          (*(this->super_StochasticVariable).super_StochasticProcess.super_Parametric.
            _vptr_Parametric[0x11])(local_1b0);
        }
        else {
          Parametric::setParameter((Parametric *)this,value_local,local_20);
        }
      }
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&d);
  return;
}

Assistant:

void Noise::setParameter( const string& name, const string& value )
{
	stringstream param;
	double d;
	param << value;
	param >> d;
	
	if (name == "mean")
		setMean(d);
	else if (name == "std.dev.")
		setStdDev(d);
	else if (name == "weight")
		setWeight(d);
	else if (name == "rate")
		setRate(d);
	else
		StochasticVariable::setParameter(name, value);
}